

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_get_user(exr_const_context_t ctxt,int part_index,char *name,char **type,int32_t *size,
                 void **out)

{
  exr_attr_opaquedata_t *peVar1;
  exr_result_t eVar2;
  void *pvVar3;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar2 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar2;
    }
    if ((name == (char *)0x0) || (*name == '\0')) {
      eVar2 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid name for opaque attribute query");
      return eVar2;
    }
    eVar2 = exr_attr_list_find_by_name
                      (ctxt,(exr_attribute_list_t *)
                            (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8),
                       name,&local_30);
    if (eVar2 == 0) {
      if (local_30->type == EXR_ATTR_OPAQUE) {
        if (type != (char **)0x0) {
          *type = local_30->type_name;
        }
        peVar1 = (local_30->field_6).opaque;
        if (peVar1->pack_func_ptr ==
            (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0) {
          if (size != (int32_t *)0x0) {
            *size = peVar1->packed_alloc_size;
          }
          if (out == (void **)0x0) {
            return 0;
          }
          pvVar3 = (void *)((local_30->field_6).m33d)->m[2];
        }
        else {
          if (size != (int32_t *)0x0) {
            *size = peVar1->unpacked_size;
          }
          if (out == (void **)0x0) {
            return 0;
          }
          pvVar3 = (void *)((local_30->field_6).m33d)->m[3];
        }
        eVar2 = 0;
        *out = pvVar3;
      }
      else {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,0x10,
                           "\'%s\' requested type \'opaque\', but stored attributes is type \'%s\'",
                           name,local_30->type_name);
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_get_user (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    const char**        type,
    int32_t*            size,
    const void**        out)
{
    ATTR_FIND_ATTR (EXR_ATTR_OPAQUE, opaque);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (type) *type = attr->type_name;

        if (attr->opaque->pack_func_ptr)
        {
            if (size) *size = attr->opaque->unpacked_size;
            if (out) *out = attr->opaque->unpacked_data;
        }
        else
        {
            if (size) *size = attr->opaque->packed_alloc_size;
            if (out) *out = attr->opaque->packed_data;
        }
    }

    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}